

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

void MAFSA_automaton_close(MAFSA_automaton ma)

{
  if (ma != (MAFSA_automaton)0x0) {
    if (ma->shared == 0) {
      free(ma->ptr_nodes);
      free(ma->ptr_links);
    }
    free(ma);
    return;
  }
  return;
}

Assistant:

extern void MAFSA_automaton_close(MAFSA_automaton ma)
{
    if (0 == ma)
    {
        return;
    }

    if (0 == ma->shared)
    {
        free(ma->ptr_nodes);
        free(ma->ptr_links);
    }

    free(ma);
}